

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::TPZDohrSubstruct
          (TPZDohrSubstruct<std::complex<long_double>_> *this,void **vtt)

{
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_a8;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_a0;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_98;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_90;
  TPZStepSolver<std::complex<long_double>_> *local_88;
  TPZFMatrix<std::complex<long_double>_> *local_80;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *local_78;
  TPZManVector<std::complex<long_double>,_10> *local_70;
  TPZFMatrix<std::complex<long_double>_> *local_68;
  TPZFMatrix<std::complex<long_double>_> *local_60;
  TPZFMatrix<std::complex<long_double>_> *local_58;
  TPZFMatrix<std::complex<long_double>_> *local_50;
  TPZStepSolver<std::complex<long_double>_> *local_48;
  TPZFMatrix<std::complex<long_double>_> *local_40;
  TPZFMatrix<std::complex<long_double>_> *local_38;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fC_star);
  local_38 = &this->fC_star;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fKeC_star);
  local_40 = &this->fKeC_star;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (&local_90,(TPZMatrix<std::complex<long_double>_> *)0x0);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(&this->finv,&local_90);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_90);
  local_50 = &this->fNullPivots;
  local_48 = &this->finv;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(local_50);
  (this->fCoarseNodes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fCoarseNodes).fStore = (int *)0x0;
  (this->fCoarseNodes).fNElements = 0;
  (this->fCoarseNodes).fNAlloc = 0;
  local_58 = &this->fC;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(local_58);
  local_60 = &this->fPhiC;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(local_60);
  local_68 = &this->fPhiC_Weighted_Condensed;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(local_68);
  (this->fCoarseIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fCoarseIndex).fStore = (int *)0x0;
  (this->fCoarseIndex).fNElements = 0;
  (this->fCoarseIndex).fNAlloc = 0;
  local_70 = &this->fWeights;
  TPZManVector<std::complex<long_double>,_10>::TPZManVector(local_70,0);
  local_78 = &this->fStiffness;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer(local_78);
  local_80 = &this->fKCi;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(local_80);
  (this->fGlobalIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fGlobalIndex).fNAlloc = 0;
  (this->fGlobalIndex).fStore = (int *)0x0;
  (this->fGlobalIndex).fNElements = 0;
  (this->fGlobalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016f3038;
  (this->fGlobalEqs).fStore = (pair<int,_int> *)0x0;
  (this->fGlobalEqs).fNElements = 0;
  (this->fGlobalEqs).fNAlloc = 0;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (&local_98,(TPZMatrix<std::complex<long_double>_> *)0x0);
  local_88 = &this->fInvertedStiffness;
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(local_88,&local_98);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_98);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (&local_a0,(TPZMatrix<std::complex<long_double>_> *)0x0);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
            (&this->fInvertedInternalStiffness,&local_a0);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_a0);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (&local_a8,(TPZMatrix<std::complex<long_double>_> *)0x0);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver(&this->fKCInvert,&local_a8);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_a8);
  (this->fInternalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fInternalEqs).fNAlloc = 0;
  (this->fInternalEqs).fStore = (int *)0x0;
  (this->fInternalEqs).fNElements = 0;
  (this->fBoundaryEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fBoundaryEqs).fStore = (int *)0x0;
  (this->fBoundaryEqs).fNElements = 0;
  (this->fBoundaryEqs).fNAlloc = 0;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fLocalLoad);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fLocalWeightedResidual);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fzi);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&this->fAdjustSolution);
  return;
}

Assistant:

TPZDohrSubstruct<TVar>::TPZDohrSubstruct()
{
	//Inicializacao
}